

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

uint32_t kratos::num_size_decrease(Var *var)

{
  Var *pVVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  while (iVar3 = 0, var->type_ == Slice) {
    pVVar1 = (Var *)var[1].super_IRNode._vptr_IRNode;
    iVar3 = (int)((long)(pVVar1->size_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)(pVVar1->size_).
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start >> 2) -
            (int)((long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(var->size_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 2);
    if (pVVar1->type_ != Slice) break;
    iVar2 = iVar2 + iVar3;
    var = pVVar1;
  }
  return iVar2 + iVar3;
}

Assistant:

uint32_t num_size_decrease(Var *var) {
    if (var->type() == VarType::Slice) {
        auto *slice = reinterpret_cast<VarSlice *>(var);
        auto *parent = slice->parent_var;
        auto diff = parent->size().size() - slice->size().size();
        if (parent->type() == VarType::Slice) {
            return diff + num_size_decrease(reinterpret_cast<VarSlice *>(parent));
        } else {
            // base case 1
            return diff;
        }
    }
    // base case 0
    return 0;
}